

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

int WebPInitDecoderConfigInternal(WebPDecoderConfig *config,int version)

{
  bool bVar1;
  
  bVar1 = (version & 0xffffff00U) == 0x200;
  if (config != (WebPDecoderConfig *)0x0 && bVar1) {
    memset(config,0,0xf0);
    WebPInitDecBufferInternal(&config->output,0x209);
  }
  return (uint)(config != (WebPDecoderConfig *)0x0 && bVar1);
}

Assistant:

int WebPInitDecoderConfigInternal(WebPDecoderConfig* config,
                                  int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DECODER_ABI_VERSION)) {
    return 0;   // version mismatch
  }
  if (config == NULL) {
    return 0;
  }
  memset(config, 0, sizeof(*config));
  DefaultFeatures(&config->input);
  WebPInitDecBuffer(&config->output);
  return 1;
}